

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

int tree_print_indent(lyout *out,int level,tp_opts *opts)

{
  int iVar1;
  int iVar2;
  char *format;
  int iVar3;
  
  iVar3 = 0;
  iVar1 = 0;
  if (opts->base_indent != 0) {
    iVar1 = ly_print(out,"%*s",(ulong)opts->base_indent," ");
  }
  if (level < 1) {
    level = 0;
  }
  for (; level != iVar3; iVar3 = iVar3 + 1) {
    format = "   ";
    if ((opts->indent & (long)(1 << ((byte)iVar3 & 0x1f))) != 0) {
      format = "|  ";
    }
    iVar2 = ly_print(out,format);
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

static int
tree_print_indent(struct lyout *out, int level, tp_opts *opts)
{
    int i, ret = 0;

    if (opts->base_indent) {
        ret += ly_print(out, "%*s", opts->base_indent, " ");
    }
    for (i = 0; i < level; ++i) {
        if (opts->indent & (1 << i)) {
            ret += ly_print(out, "|  ");
        } else {
            ret += ly_print(out, "   ");
        }
    }

    return ret;
}